

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxcover.cpp
# Opt level: O2

size_t sets_union<448ul,std::array<unsigned_long,5ul>>
                 (vector<std::bitset<448UL>,_std::allocator<std::bitset<448UL>_>_> *binary_sets,
                 array<unsigned_long,_5UL> *c)

{
  pointer pbVar1;
  unsigned_long uVar2;
  pointer pbVar3;
  size_t sVar4;
  long lVar5;
  value_type x;
  _Base_bitset<7UL> _Stack_58;
  
  uVar2 = c->_M_elems[0];
  pbVar3 = (binary_sets->
           super__Vector_base<std::bitset<448UL>,_std::allocator<std::bitset<448UL>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pbVar1 = pbVar3 + uVar2;
  _Stack_58._M_w[0] = (pbVar1->super__Base_bitset<7UL>)._M_w[0];
  _Stack_58._M_w[1] = (pbVar1->super__Base_bitset<7UL>)._M_w[1];
  _Stack_58._M_w[2] = (pbVar1->super__Base_bitset<7UL>)._M_w[2];
  _Stack_58._M_w[3] = (pbVar1->super__Base_bitset<7UL>)._M_w[3];
  _Stack_58._M_w[4] = pbVar3[uVar2].super__Base_bitset<7UL>._M_w[4];
  _Stack_58._M_w[5] = pbVar3[uVar2].super__Base_bitset<7UL>._M_w[5];
  _Stack_58._M_w[6] = pbVar3[uVar2].super__Base_bitset<7UL>._M_w[6];
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    std::_Base_bitset<7UL>::_M_do_or
              (&_Stack_58,
               &(binary_sets->
                super__Vector_base<std::bitset<448UL>,_std::allocator<std::bitset<448UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start[c->_M_elems[lVar5 + 1]].
                super__Base_bitset<7UL>);
  }
  sVar4 = std::_Base_bitset<7UL>::_M_do_count(&_Stack_58);
  return sVar4;
}

Assistant:

size_t sets_union(const std::vector<std::bitset<n_entities>>& binary_sets, const Collection& c)
{
    auto x = binary_sets[c[0]];
    for (size_t i = 1; i < c.size(); ++i)
        x |= binary_sets[c[i]];
    return x.count();
}